

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::compare
          (InvariantInnerTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  TestLog *pTVar1;
  IsInnerQuadTriangle local_2e;
  IsInnerTriangleTriangle local_2d;
  int local_2c;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvStack_28;
  int param_3_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA_local;
  InvariantInnerTriangleSetCase *this_local;
  
  local_2c = param_3;
  pvStack_28 = coordsB;
  coordsB_local = coordsA;
  coordsA_local = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)this;
  if ((this->super_PrimitiveSetInvarianceCase).m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    this_local._7_1_ =
         compareTriangleSets<deqp::gles31::Functional::(anonymous_namespace)::InvariantInnerTriangleSetCase::IsInnerTriangleTriangle>
                   (coordsA,coordsB,pTVar1,&local_2d,"outer triangles");
  }
  else if ((this->super_PrimitiveSetInvarianceCase).m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    this_local._7_1_ =
         compareTriangleSets<deqp::gles31::Functional::(anonymous_namespace)::InvariantInnerTriangleSetCase::IsInnerQuadTriangle>
                   (coordsA,coordsB,pTVar1,&local_2e,"outer triangles");
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}